

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::funcAllowed
          (SparseTextureClampLookupResidencyTestCase *this,GLint target,GLint format,
          FunctionToken *funcToken)

{
  bool bVar1;
  _Self local_38;
  _Self local_30;
  FunctionToken *local_28;
  FunctionToken *funcToken_local;
  GLint format_local;
  GLint target_local;
  SparseTextureClampLookupResidencyTestCase *this_local;
  
  local_28 = funcToken;
  funcToken_local._0_4_ = format;
  funcToken_local._4_4_ = target;
  _format_local = this;
  local_30._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find
                 (&funcToken->allowedTargets,(key_type_conflict *)((long)&funcToken_local + 4));
  local_38._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end(&local_28->allowedTargets);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else if ((((GLint)funcToken_local == 0x81a5) && (funcToken_local._4_4_ == 0x9009)) &&
          (bVar1 = std::operator==(&local_28->name,"sparseTextureGradClampARB"), bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SparseTextureClampLookupResidencyTestCase::funcAllowed(GLint target, GLint format, FunctionToken& funcToken)
{
	if (funcToken.allowedTargets.find(target) == funcToken.allowedTargets.end())
		return false;

	if (format == GL_DEPTH_COMPONENT16)
	{
		if (target == GL_TEXTURE_CUBE_MAP_ARRAY && funcToken.name == "sparseTextureGradClampARB")
			return false;
	}

	return true;
}